

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator=
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *matrix)

{
  complex<float> *pcVar1;
  complex<float> *__s;
  ulong uVar2;
  long lVar3;
  
  lVar3 = matrix->size_;
  if (lVar3 != this->size_) {
    this->size_ = lVar3;
    if (lVar3 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                    ,0x12,
                    "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<float>]"
                   );
    }
    uVar2 = lVar3 * lVar3 * 8;
    __s = (complex<float> *)operator_new__(-(ulong)((ulong)(lVar3 * lVar3) >> 0x3d != 0) | uVar2);
    memset(__s,0,uVar2);
    pcVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = __s;
    if (pcVar1 == (complex<float> *)0x0) goto LAB_0015e3c5;
    operator_delete__(pcVar1);
    lVar3 = this->size_;
  }
  if (lVar3 == 0) {
    return this;
  }
LAB_0015e3c5:
  pcVar1 = (matrix->data_)._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  uVar2 = 0;
  do {
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[uVar2]._M_value =
         pcVar1[uVar2]._M_value;
    uVar2 = uVar2 + 1;
  } while (uVar2 < (ulong)(this->size_ * this->size_));
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }